

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

void * rcg::(anonymous_namespace)::getBufferValue<void*>
                 (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,
                 BUFFER_INFO_CMD cmd)

{
  GC_ERROR GVar1;
  void *ret;
  size_t size;
  INFO_DATATYPE type;
  void *local_18;
  size_t local_10;
  INFO_DATATYPE local_4;
  
  local_18 = (void *)0x0;
  local_10 = 8;
  if ((buffer == (void *)0x0 || stream == (void *)0x0) ||
     (GVar1 = (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->DSGetBufferInfo)(stream,buffer,cmd,&local_4,&local_18,&local_10),
     GVar1 != 0)) {
    local_18 = (void *)0x0;
  }
  return local_18;
}

Assistant:

inline T getBufferValue(const std::shared_ptr<const GenTLWrapper> &gentl,
                                          void *stream, void *buffer, GenTL::BUFFER_INFO_CMD cmd)
{
  T ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(T);

  if (stream != 0 && buffer != 0)
  {
    if (gentl->DSGetBufferInfo(stream, buffer, cmd, &type, &ret, &size) != GenTL::GC_ERR_SUCCESS)
    {
      ret=0;
    }
  }

  return ret;
}